

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::reserve(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
          *this,size_t n)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    poVar1 = pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>
             ::allocate_object<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>
                       ((polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>
                         *)this,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::optional
                ((optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)
                 ((long)&poVar1->optionalValue + lVar2),
                 (optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)
                 ((long)&this->ptr->optionalValue + lVar2));
      optional<std::pair<pbrt::LightHandle,_unsigned_long>_>::~optional
                ((optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *)
                 ((long)&this->ptr->optionalValue + lVar2));
      lVar2 = lVar2 + 0x18;
    }
    pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>::
    deallocate_object<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>>
              ((polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,unsigned_long>>> *)
               this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = poVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }